

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkComputePipelineCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkComputePipelineCreateInfo>
          (Impl *this,VkComputePipelineCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkComputePipelineCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkComputePipelineCreateInfo>(alloc,count);
    if (pVVar1 != (VkComputePipelineCreateInfo *)0x0) {
      pVVar1 = (VkComputePipelineCreateInfo *)memmove(pVVar1,src,count * 0x60);
      return pVVar1;
    }
  }
  return (VkComputePipelineCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}